

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcUniformBlockCase.cpp
# Opt level: O3

void __thiscall deqp::ub::ShaderInterface::~ShaderInterface(ShaderInterface *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  StructType *this_00;
  UniformBlock *pUVar2;
  pointer pcVar3;
  pointer ppUVar4;
  pointer ppSVar5;
  
  ppSVar5 = (this->m_structs).
            super__Vector_base<deqp::ub::StructType_*,_std::allocator<deqp::ub::StructType_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppSVar5 !=
      (this->m_structs).
      super__Vector_base<deqp::ub::StructType_*,_std::allocator<deqp::ub::StructType_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      this_00 = *ppSVar5;
      if (this_00 != (StructType *)0x0) {
        StructType::~StructType(this_00);
      }
      operator_delete(this_00,0x38);
      ppSVar5 = ppSVar5 + 1;
    } while (ppSVar5 !=
             (this->m_structs).
             super__Vector_base<deqp::ub::StructType_*,_std::allocator<deqp::ub::StructType_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  ppUVar4 = (this->m_uniformBlocks).
            super__Vector_base<deqp::ub::UniformBlock_*,_std::allocator<deqp::ub::UniformBlock_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppUVar4 !=
      (this->m_uniformBlocks).
      super__Vector_base<deqp::ub::UniformBlock_*,_std::allocator<deqp::ub::UniformBlock_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      pUVar2 = *ppUVar4;
      if (pUVar2 != (UniformBlock *)0x0) {
        std::vector<deqp::ub::Uniform,_std::allocator<deqp::ub::Uniform>_>::~vector
                  (&pUVar2->m_uniforms);
        pcVar3 = (pUVar2->m_instanceName)._M_dataplus._M_p;
        paVar1 = &(pUVar2->m_instanceName).field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar3 != paVar1) {
          operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
        }
        pcVar3 = (pUVar2->m_blockName)._M_dataplus._M_p;
        paVar1 = &(pUVar2->m_blockName).field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar3 != paVar1) {
          operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
        }
      }
      operator_delete(pUVar2,0x60);
      ppUVar4 = ppUVar4 + 1;
    } while (ppUVar4 !=
             (this->m_uniformBlocks).
             super__Vector_base<deqp::ub::UniformBlock_*,_std::allocator<deqp::ub::UniformBlock_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
    ppUVar4 = (this->m_uniformBlocks).
              super__Vector_base<deqp::ub::UniformBlock_*,_std::allocator<deqp::ub::UniformBlock_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  if (ppUVar4 != (pointer)0x0) {
    operator_delete(ppUVar4,(long)(this->m_uniformBlocks).
                                  super__Vector_base<deqp::ub::UniformBlock_*,_std::allocator<deqp::ub::UniformBlock_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppUVar4
                   );
  }
  ppSVar5 = (this->m_structs).
            super__Vector_base<deqp::ub::StructType_*,_std::allocator<deqp::ub::StructType_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppSVar5 != (pointer)0x0) {
    operator_delete(ppSVar5,(long)(this->m_structs).
                                  super__Vector_base<deqp::ub::StructType_*,_std::allocator<deqp::ub::StructType_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppSVar5
                   );
    return;
  }
  return;
}

Assistant:

ShaderInterface::~ShaderInterface(void)
{
	for (std::vector<StructType*>::iterator i = m_structs.begin(); i != m_structs.end(); i++)
		delete *i;

	for (std::vector<UniformBlock*>::iterator i = m_uniformBlocks.begin(); i != m_uniformBlocks.end(); i++)
		delete *i;
}